

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
::_add_to(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
          *this,Column *column,Tmp_column *set,uint coef)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar2;
  ID_index local_6c;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> local_68;
  reference local_58;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column *__range3;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> res_insert;
  uint coef_local;
  Tmp_column *set_local;
  Column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
  *this_local;
  
  res_insert._12_4_ = coef;
  std::pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool>::
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> *)&__range3);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
  ::begin((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
           *)&__end0);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
  ::end((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
         *)&entry);
  while( true ) {
    bVar1 = boost::intrusive::operator!=
                      (&__end0,(list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>,_true>
                                *)&entry);
    if (!bVar1) break;
    local_58 = boost::intrusive::
               list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>,_true>
               ::operator*(&__end0);
    local_6c = Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>
               ::get_row_index(local_58);
    pVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (set,&local_6c);
    local_68.first = pVar2.first._M_node;
    local_68.second = pVar2.second;
    std::pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool>::operator=
              ((pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> *)&__range3,&local_68);
    if (((byte)res_insert.first._M_node & 1) == 0) {
      std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::erase_abi_cxx11_
                ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)set,
                 (const_iterator)__range3);
    }
    boost::intrusive::
    list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_add_to(const Column& column,
                                                 Tmp_column& set,
                                                 [[maybe_unused]] unsigned int coef)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    std::pair<typename std::set<Index>::iterator, bool> res_insert;
    for (const Entry& entry : column) {
      res_insert = set.insert(entry.get_row_index());
      if (!res_insert.second) {
        set.erase(res_insert.first);
      }
    }
  } else {
    auto& operators = colSettings_->operators;
    for (const Entry& entry : column) {
      auto res = set.emplace(entry.get_row_index(), entry.get_element());
      if (res.second){
        operators.multiply_inplace(res.first->second, coef);
      } else {
        operators.multiply_and_add_inplace_back(entry.get_element(), coef, res.first->second);
        if (res.first->second == Field_operators::get_additive_identity()) {
          set.erase(res.first);
        }
      }
    }
  }
}